

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O1

void anon_unknown.dwarf_4ac5::Test_TemplateDictionary_SetValueAndShowSection::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  char *pcVar12;
  bool bVar13;
  int iVar14;
  undefined8 extraout_RAX;
  bool *pbVar15;
  TemplateDictionaryPeer peer;
  string dump;
  TemplateDictionary dict;
  TemplateDictionaryPeer local_228;
  TemplateString local_220;
  char *local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  undefined8 uStack_1e8;
  char *local_1e0;
  undefined8 uStack_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  undefined8 uStack_1c8;
  char *local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined8 uStack_1a8;
  char *local_1a0;
  undefined8 uStack_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined8 uStack_188;
  char *local_180;
  undefined8 uStack_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  char *local_160;
  undefined8 uStack_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  char *local_140;
  undefined8 uStack_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  char *local_120;
  undefined8 uStack_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  char *local_100;
  undefined8 uStack_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  char *local_e0;
  undefined8 uStack_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  char *local_c0;
  undefined8 uStack_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  undefined8 uStack_a8;
  TemplateDictionary local_a0 [112];
  
  local_220.ptr_ = "test_SetValueAndShowSection";
  local_220.length_ = 0x1b;
  local_220.is_immutable_ = true;
  local_220.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary(local_a0,&local_220,(UnsafeArena *)0x0);
  local_c0 = "TOPLEVEL";
  uStack_b8 = 8;
  local_b0 = 1;
  uStack_a8 = 0;
  local_e0 = "foo";
  uStack_d8 = 3;
  local_d0 = 1;
  uStack_c8 = 0;
  TVar5._17_7_ = uStack_cf;
  TVar5.is_immutable_ = true;
  TVar1._17_7_ = uStack_af;
  TVar1.is_immutable_ = true;
  TVar1.length_ = 8;
  TVar1.ptr_ = "TOPLEVEL";
  TVar1.id_ = 0;
  TVar5.length_ = 3;
  TVar5.ptr_ = "foo";
  TVar5.id_ = 0;
  local_228.dict_ = local_a0;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar5);
  local_100 = "INSEC";
  uStack_f8 = 5;
  local_f0 = 1;
  uStack_e8 = 0;
  local_120 = "bar";
  uStack_118 = 3;
  local_110 = 1;
  uStack_108 = 0;
  local_140 = "SEC1";
  uStack_138 = 4;
  local_130 = 1;
  uStack_128 = 0;
  TVar9._17_7_ = uStack_12f;
  TVar9.is_immutable_ = true;
  TVar6._17_7_ = uStack_10f;
  TVar6.is_immutable_ = true;
  TVar2._17_7_ = uStack_ef;
  TVar2.is_immutable_ = true;
  TVar2.length_ = 5;
  TVar2.ptr_ = "INSEC";
  TVar2.id_ = 0;
  TVar6.length_ = 3;
  TVar6.ptr_ = "bar";
  TVar6.id_ = 0;
  TVar9.length_ = 4;
  TVar9.ptr_ = "SEC1";
  TVar9.id_ = 0;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar2,TVar6,TVar9);
  local_160 = "NOTINSEC";
  uStack_158 = 8;
  local_150 = 1;
  uStack_148 = 0;
  local_180 = "";
  uStack_178 = 0;
  local_170 = 1;
  uStack_168 = 0;
  local_1a0 = "SEC2";
  uStack_198 = 4;
  local_190 = 1;
  uStack_188 = 0;
  TVar10._17_7_ = uStack_18f;
  TVar10.is_immutable_ = true;
  TVar7._17_7_ = uStack_16f;
  TVar7.is_immutable_ = true;
  TVar3._17_7_ = uStack_14f;
  TVar3.is_immutable_ = true;
  TVar3.length_ = 8;
  TVar3.ptr_ = "NOTINSEC";
  TVar3.id_ = 0;
  TVar7.ptr_ = "";
  TVar7.length_ = 0;
  TVar7.id_ = 0;
  TVar10.length_ = 4;
  TVar10.ptr_ = "SEC2";
  TVar10.id_ = 0;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar3,TVar7,TVar10);
  local_1c0 = "NOTINSEC2";
  uStack_1b8 = 9;
  local_1b0 = 1;
  uStack_1a8 = 0;
  local_1e0 = "";
  uStack_1d8 = 0;
  local_1d0 = 1;
  uStack_1c8 = 0;
  local_200 = "SEC3";
  uStack_1f8 = 4;
  pbVar15 = (bool *)0x10a101;
  local_1f0 = 1;
  uStack_1e8 = 0;
  TVar11._17_7_ = uStack_1ef;
  TVar11.is_immutable_ = true;
  TVar8._17_7_ = uStack_1cf;
  TVar8.is_immutable_ = true;
  TVar4._17_7_ = uStack_1af;
  TVar4.is_immutable_ = true;
  TVar4.length_ = 9;
  TVar4.ptr_ = "NOTINSEC2";
  TVar4.id_ = 0;
  TVar8.ptr_ = "";
  TVar8.length_ = 0;
  TVar8.id_ = 0;
  TVar11.length_ = 4;
  TVar11.ptr_ = "SEC3";
  TVar11.id_ = 0;
  ctemplate::TemplateDictionary::SetValueAndShowSection(TVar4,TVar8,TVar11);
  local_220.ptr_ = "SEC1";
  local_220.length_ = 4;
  local_220.is_immutable_ = true;
  local_220.id_ = 0;
  bVar13 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_228,&local_220);
  if (bVar13) {
    _GLOBAL__N_1::Test_TemplateDictionary_SetValueAndShowSection::Run();
LAB_0010e806:
    _GLOBAL__N_1::Test_TemplateDictionary_SetValueAndShowSection::Run();
  }
  else {
    local_220.ptr_ = "SEC2";
    local_220.length_ = 4;
    local_220.is_immutable_ = true;
    local_220.id_ = 0;
    bVar13 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_228,&local_220);
    if (!bVar13) goto LAB_0010e806;
    local_220.ptr_ = "SEC3";
    local_220.length_ = 4;
    local_220.is_immutable_ = true;
    local_220.id_ = 0;
    bVar13 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_228,&local_220);
    if (bVar13) {
      pbVar15 = &local_220.is_immutable_;
      local_220.length_ = 0;
      local_220.is_immutable_ = false;
      local_220.ptr_ = pbVar15;
      ctemplate::TemplateDictionary::DumpToString((string *)local_a0,(int)&local_220);
      pcVar12 = local_220.ptr_;
      iVar14 = strcmp(local_220.ptr_,
                      "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_SetValueAndShowSection\' {\n   TOPLEVEL: >foo<\n   section SEC1 (dict 1 of 1) -->\n     dictionary \'test_SetValueAndShowSection/SEC1#1\' {\n       INSEC: >bar<\n     }\n}\n"
                     );
      if (iVar14 == 0) {
        if ((bool *)pcVar12 != pbVar15) {
          operator_delete(pcVar12);
        }
        ctemplate::TemplateDictionary::~TemplateDictionary(local_a0);
        return;
      }
      goto LAB_0010e810;
    }
  }
  _GLOBAL__N_1::Test_TemplateDictionary_SetValueAndShowSection::Run();
LAB_0010e810:
  _GLOBAL__N_1::Test_TemplateDictionary_SetValueAndShowSection::Run();
  if ((bool *)local_220.ptr_ != pbVar15) {
    operator_delete(local_220.ptr_);
  }
  ctemplate::TemplateDictionary::~TemplateDictionary(local_a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(TemplateDictionary, SetValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // sizeof("not_v") == sizeof("value")
}